

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O1

bool __thiscall Quest_Context::CheckRule(Quest_Context *this,Expression *expr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  Gender GVar3;
  pointer pcVar4;
  Character *pCVar5;
  size_t __n;
  bool bVar6;
  bool bVar7;
  short sVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  _Elt_pointer pvVar13;
  time_t tVar14;
  ushort *puVar15;
  int *piVar16;
  mapped_type *pmVar17;
  size_type sVar18;
  variant *pvVar19;
  uint uVar20;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
  *this_00;
  long lVar21;
  _Elt_pointer pbVar22;
  long *plVar23;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  string function_name;
  allocator_type local_1c1;
  long *local_1c0 [2];
  long local_1b0 [2];
  undefined1 local_1a0 [32];
  string local_180;
  _Elt_pointer local_160 [2];
  undefined1 local_150 [48];
  string local_120;
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  long *local_e0 [2];
  long local_d0 [2];
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  string local_70;
  string local_50;
  
  if ((this->quest->quest->info).disabled != false) {
    return false;
  }
  local_1c0[0] = local_1b0;
  pcVar4 = (expr->function)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c0,pcVar4,pcVar4 + (expr->function)._M_string_length);
  iVar9 = std::__cxx11::string::compare((char *)local_1c0);
  bVar6 = true;
  if (iVar9 == 0) goto LAB_0018a02f;
  iVar9 = std::__cxx11::string::compare((char *)local_1c0);
  if (iVar9 == 0) {
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_1a0 + 0x10);
    local_1a0._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"d","");
    this_00 = &this->progress;
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
              ::operator[](this_00,(key_type *)local_1a0);
    sVar8 = *pmVar17;
    tVar14 = time((time_t *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._0_8_ != paVar1) {
      operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
    }
    if ((((uint)(SUB168(SEXT816(tVar14) * SEXT816(0x1845c8a0ce512957),8) >> 0xd) & 0x7ffff) -
         (SUB164(SEXT816(tVar14) * SEXT816(0x1845c8a0ce512957),0xc) >> 0x1f) & 0x7fff) == (int)sVar8
       ) {
      local_1a0._0_8_ = paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"c","");
      pmVar17 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                ::operator[](this_00,(key_type *)local_1a0);
      pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar12 = (long)pvVar13 -
               (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_first >> 6;
      if (7 < uVar12) {
        pvVar13 = (_Elt_pointer)
                  ((ulong)(((uint)uVar12 & 7) << 6) +
                  *(long *)((long)(expr->args).
                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                  _M_impl.super__Deque_impl_data._M_start._M_node +
                           (uVar12 & 0xfffffffffffffff8)));
      }
      sVar8 = *pmVar17;
      iVar9 = util::variant::GetInt(pvVar13);
      bVar6 = iVar9 <= sVar8;
      local_50._M_dataplus._M_p = (pointer)local_1a0._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._0_8_ == paVar1) goto LAB_0018a02f;
      goto LAB_001899f9;
    }
    tVar14 = time((time_t *)0x0);
    local_1a0._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"d","");
    puVar15 = (ushort *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
              ::operator[](this_00,(key_type *)local_1a0);
    *puVar15 = (short)(SUB168(SEXT816(tVar14) * SEXT816(0x1845c8a0ce512957),8) >> 0xd) -
               (SUB162(SEXT816(tVar14) * SEXT816(0x1845c8a0ce512957),0xe) >> 0xf) & 0x7fff;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._0_8_ != paVar1) {
      operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
    }
    local_1a0._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"c","");
    pmVar17 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
              ::operator[](this_00,(key_type *)local_1a0);
    *pmVar17 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._0_8_ != paVar1) {
      operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
    }
    goto LAB_00189b04;
  }
  iVar9 = std::__cxx11::string::compare((char *)local_1c0);
  if (iVar9 == 0) {
    pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    uVar12 = (long)pvVar13 -
             (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_first >> 6;
    if (7 < uVar12) {
      pvVar13 = (_Elt_pointer)
                ((ulong)(((uint)uVar12 & 7) << 6) +
                *(long *)((long)(expr->args).
                                super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                _M_impl.super__Deque_impl_data._M_start._M_node +
                         (uVar12 & 0xfffffffffffffff8)));
    }
    uVar20 = (uint)this->character->map->id;
    uVar10 = util::variant::GetInt(pvVar13);
    goto LAB_00189a50;
  }
  iVar9 = std::__cxx11::string::compare((char *)local_1c0);
  if (iVar9 == 0) {
    pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    uVar12 = (long)pvVar13 -
             (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_first >> 6;
    if (7 < uVar12) {
      pvVar13 = (_Elt_pointer)
                ((ulong)(((uint)uVar12 & 7) << 6) +
                *(long *)((long)(expr->args).
                                super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                _M_impl.super__Deque_impl_data._M_start._M_node +
                         (uVar12 & 0xfffffffffffffff8)));
    }
    sVar8 = this->character->map->id;
    iVar9 = util::variant::GetInt(pvVar13);
    if (iVar9 == sVar8) {
      pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar12 = ((long)pvVar13 -
                (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_first >> 6) + 1;
      if (uVar12 < 8) {
        pvVar19 = pvVar13 + 1;
      }
      else {
        pvVar19 = (variant *)
                  ((ulong)(((uint)uVar12 & 7) << 6) +
                  *(long *)((long)(expr->args).
                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                  _M_impl.super__Deque_impl_data._M_start._M_node +
                           (uVar12 & 0xfffffffffffffff8)));
      }
      bVar2 = this->character->x;
      uVar10 = util::variant::GetInt(pvVar19);
      if (uVar10 == bVar2) {
        pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar12 = ((long)pvVar13 -
                  (long)(expr->args).
                        super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first >> 6) + 2;
        if (uVar12 < 8) {
          pvVar19 = pvVar13 + 2;
        }
        else {
          pvVar19 = (variant *)
                    ((ulong)(((uint)uVar12 & 7) << 6) +
                    *(long *)((long)(expr->args).
                                    super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_node +
                             (uVar12 & 0xfffffffffffffff8)));
        }
        uVar20 = (uint)this->character->y;
        uVar10 = util::variant::GetInt(pvVar19);
        goto LAB_00189a50;
      }
    }
LAB_00189f59:
    bVar6 = false;
    goto LAB_0018a02f;
  }
  iVar9 = std::__cxx11::string::compare((char *)local_1c0);
  if (iVar9 == 0) {
    pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    uVar12 = (long)pvVar13 -
             (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_first >> 6;
    if (7 < uVar12) {
      pvVar13 = (_Elt_pointer)
                ((ulong)(((uint)uVar12 & 7) << 6) +
                *(long *)((long)(expr->args).
                                super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                _M_impl.super__Deque_impl_data._M_start._M_node +
                         (uVar12 & 0xfffffffffffffff8)));
    }
    uVar20 = (uint)this->character->map->id;
    uVar10 = util::variant::GetInt(pvVar13);
LAB_00189bdb:
    bVar6 = uVar10 == uVar20;
  }
  else {
    iVar9 = std::__cxx11::string::compare((char *)local_1c0);
    if (iVar9 == 0) {
      pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar12 = (long)pvVar13 -
               (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_first >> 6;
      if (7 < uVar12) {
        pvVar13 = (_Elt_pointer)
                  ((ulong)(((uint)uVar12 & 7) << 6) +
                  *(long *)((long)(expr->args).
                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                  _M_impl.super__Deque_impl_data._M_start._M_node +
                           (uVar12 & 0xfffffffffffffff8)));
      }
      sVar8 = this->character->map->id;
      iVar9 = util::variant::GetInt(pvVar13);
      if (iVar9 != sVar8) goto LAB_0018a02f;
      pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar12 = ((long)pvVar13 -
                (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_first >> 6) + 1;
      if (uVar12 < 8) {
        pvVar19 = pvVar13 + 1;
      }
      else {
        pvVar19 = (variant *)
                  ((ulong)(((uint)uVar12 & 7) << 6) +
                  *(long *)((long)(expr->args).
                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                  _M_impl.super__Deque_impl_data._M_start._M_node +
                           (uVar12 & 0xfffffffffffffff8)));
      }
      bVar2 = this->character->x;
      uVar10 = util::variant::GetInt(pvVar19);
      if (uVar10 != bVar2) goto LAB_0018a02f;
      pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar12 = ((long)pvVar13 -
                (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_first >> 6) + 2;
      if (uVar12 < 8) {
        pvVar19 = pvVar13 + 2;
      }
      else {
        pvVar19 = (variant *)
                  ((ulong)(((uint)uVar12 & 7) << 6) +
                  *(long *)((long)(expr->args).
                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                  _M_impl.super__Deque_impl_data._M_start._M_node +
                           (uVar12 & 0xfffffffffffffff8)));
      }
      uVar20 = (uint)this->character->y;
      uVar10 = util::variant::GetInt(pvVar19);
      goto LAB_00189bdb;
    }
    iVar9 = std::__cxx11::string::compare((char *)local_1c0);
    if (iVar9 == 0) {
      pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar12 = (long)pvVar13 -
               (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_first >> 6;
      if (7 < uVar12) {
        pvVar13 = (_Elt_pointer)
                  ((ulong)(((uint)uVar12 & 7) << 6) +
                  *(long *)((long)(expr->args).
                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                  _M_impl.super__Deque_impl_data._M_start._M_node +
                           (uVar12 & 0xfffffffffffffff8)));
      }
      pCVar5 = this->character;
      iVar9 = util::variant::GetInt(pvVar13);
      iVar9 = Character::HasItem(pCVar5,(short)iVar9,false);
      sVar18 = std::deque<util::variant,_std::allocator<util::variant>_>::size(&expr->args);
      iVar11 = 1;
      if (1 < sVar18) {
        pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar12 = ((long)pvVar13 -
                  (long)(expr->args).
                        super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first >> 6) + 1;
        if (uVar12 < 8) {
          pvVar19 = pvVar13 + 1;
        }
        else {
          pvVar19 = (variant *)
                    ((ulong)(((uint)uVar12 & 7) << 6) +
                    *(long *)((long)(expr->args).
                                    super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_node +
                             (uVar12 & 0xfffffffffffffff8)));
        }
        iVar11 = util::variant::GetInt(pvVar19);
      }
      bVar6 = iVar11 <= iVar9;
      goto LAB_0018a02f;
    }
    iVar9 = std::__cxx11::string::compare((char *)local_1c0);
    if (iVar9 == 0) {
      pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar12 = (long)pvVar13 -
               (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_first >> 6;
      if (7 < uVar12) {
        pvVar13 = (_Elt_pointer)
                  ((ulong)(((uint)uVar12 & 7) << 6) +
                  *(long *)((long)(expr->args).
                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                  _M_impl.super__Deque_impl_data._M_start._M_node +
                           (uVar12 & 0xfffffffffffffff8)));
      }
      pCVar5 = this->character;
      iVar9 = util::variant::GetInt(pvVar13);
      iVar9 = Character::HasItem(pCVar5,(short)iVar9,false);
      sVar18 = std::deque<util::variant,_std::allocator<util::variant>_>::size(&expr->args);
      iVar11 = 1;
      if (1 < sVar18) {
        pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar12 = ((long)pvVar13 -
                  (long)(expr->args).
                        super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                        super__Deque_impl_data._M_start._M_first >> 6) + 1;
        if (uVar12 < 8) {
          pvVar19 = pvVar13 + 1;
        }
        else {
          pvVar19 = (variant *)
                    ((ulong)(((uint)uVar12 & 7) << 6) +
                    *(long *)((long)(expr->args).
                                    super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_node +
                             (uVar12 & 0xfffffffffffffff8)));
        }
        iVar11 = util::variant::GetInt(pvVar19);
      }
      bVar6 = iVar9 < iVar11;
      goto LAB_0018a02f;
    }
    iVar9 = std::__cxx11::string::compare((char *)local_1c0);
    if (iVar9 == 0) {
      pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar12 = (long)pvVar13 -
               (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_first >> 6;
      if (7 < uVar12) {
        pvVar13 = (_Elt_pointer)
                  ((ulong)(((uint)uVar12 & 7) << 6) +
                  *(long *)((long)(expr->args).
                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                  _M_impl.super__Deque_impl_data._M_start._M_node +
                           (uVar12 & 0xfffffffffffffff8)));
      }
      pCVar5 = this->character;
      iVar9 = util::variant::GetInt(pvVar13);
      bVar7 = Character::HasSpell(pCVar5,(short)iVar9);
      if (bVar7) {
        sVar18 = std::deque<util::variant,_std::allocator<util::variant>_>::size(&expr->args);
        if (1 < sVar18) {
          pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar12 = (long)pvVar13 -
                   (long)(expr->args).
                         super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                         super__Deque_impl_data._M_start._M_first >> 6;
          if (7 < uVar12) {
            pvVar13 = (_Elt_pointer)
                      ((ulong)(((uint)uVar12 & 7) << 6) +
                      *(long *)((long)(expr->args).
                                      super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_node +
                               (uVar12 & 0xfffffffffffffff8)));
          }
          pCVar5 = this->character;
          iVar9 = util::variant::GetInt(pvVar13);
          sVar8 = Character::SpellLevel(pCVar5,(short)iVar9);
          pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar12 = ((long)pvVar13 -
                    (long)(expr->args).
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 6) + 1;
          if (uVar12 < 8) {
            pvVar19 = pvVar13 + 1;
          }
          else {
            pvVar19 = (variant *)
                      ((ulong)(((uint)uVar12 & 7) << 6) +
                      *(long *)((long)(expr->args).
                                      super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_node +
                               (uVar12 & 0xfffffffffffffff8)));
          }
          iVar9 = util::variant::GetInt(pvVar19);
          bVar6 = iVar9 <= sVar8;
        }
        goto LAB_0018a02f;
      }
      goto LAB_00189f59;
    }
    iVar9 = std::__cxx11::string::compare((char *)local_1c0);
    if (iVar9 == 0) {
      pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar12 = (long)pvVar13 -
               (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_first >> 6;
      if (7 < uVar12) {
        pvVar13 = (_Elt_pointer)
                  ((ulong)(((uint)uVar12 & 7) << 6) +
                  *(long *)((long)(expr->args).
                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                  _M_impl.super__Deque_impl_data._M_start._M_node +
                           (uVar12 & 0xfffffffffffffff8)));
      }
      pCVar5 = this->character;
      iVar9 = util::variant::GetInt(pvVar13);
      bVar6 = Character::HasSpell(pCVar5,(short)iVar9);
      bVar6 = !bVar6;
      goto LAB_0018a02f;
    }
    iVar9 = std::__cxx11::string::compare((char *)local_1c0);
    if (iVar9 == 0) {
      pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar12 = (long)pvVar13 -
               (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_first >> 6;
      if (7 < uVar12) {
        pvVar13 = (_Elt_pointer)
                  ((ulong)(((uint)uVar12 & 7) << 6) +
                  *(long *)((long)(expr->args).
                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                  _M_impl.super__Deque_impl_data._M_start._M_node +
                           (uVar12 & 0xfffffffffffffff8)));
      }
      GVar3 = this->character->gender;
      iVar9 = util::variant::GetInt(pvVar13);
      bVar6 = GVar3 == (Gender)iVar9;
      goto LAB_0018a02f;
    }
    iVar9 = std::__cxx11::string::compare((char *)local_1c0);
    if (iVar9 == 0) {
      pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar12 = (long)pvVar13 -
               (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_first >> 6;
      if (7 < uVar12) {
        pvVar13 = (_Elt_pointer)
                  ((ulong)(((uint)uVar12 & 7) << 6) +
                  *(long *)((long)(expr->args).
                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                  _M_impl.super__Deque_impl_data._M_start._M_node +
                           (uVar12 & 0xfffffffffffffff8)));
      }
      uVar20 = (uint)this->character->clas;
      uVar10 = util::variant::GetInt(pvVar13);
LAB_00189a50:
      bVar6 = uVar10 == uVar20;
      goto LAB_0018a02f;
    }
    iVar9 = std::__cxx11::string::compare((char *)local_1c0);
    if (iVar9 == 0) {
      pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar12 = (long)pvVar13 -
               (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_first >> 6;
      if (7 < uVar12) {
        pvVar13 = (_Elt_pointer)
                  ((ulong)(((uint)uVar12 & 7) << 6) +
                  *(long *)((long)(expr->args).
                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                  _M_impl.super__Deque_impl_data._M_start._M_node +
                           (uVar12 & 0xfffffffffffffff8)));
      }
      uVar20 = (uint)this->character->race;
      uVar10 = util::variant::GetInt(pvVar13);
      goto LAB_00189a50;
    }
    iVar9 = std::__cxx11::string::compare((char *)local_1c0);
    if (iVar9 != 0) {
      iVar9 = std::__cxx11::string::compare((char *)local_1c0);
      if (iVar9 == 0) {
        pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar12 = (long)pvVar13 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 6;
        if (7 < uVar12) {
          pvVar13 = (_Elt_pointer)
                    ((ulong)(((uint)uVar12 & 7) << 6) +
                    *(long *)((long)(expr->args).
                                    super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_node +
                             (uVar12 & 0xfffffffffffffff8)));
        }
        pCVar5 = this->character;
        util::variant::GetString_abi_cxx11_((string *)local_1a0,pvVar13);
        __n = (pCVar5->home)._M_string_length;
        if (__n == local_1a0._8_8_) {
          if (__n == 0) {
            bVar6 = true;
          }
          else {
            iVar9 = bcmp((pCVar5->home)._M_dataplus._M_p,(void *)local_1a0._0_8_,__n);
            bVar6 = iVar9 == 0;
          }
        }
        else {
          bVar6 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_1a0 + 0x10)) {
          operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
        }
        goto LAB_0018a02f;
      }
      iVar9 = std::__cxx11::string::compare((char *)local_1c0);
      if (iVar9 == 0) {
        local_1a0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_1a0 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"r","");
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                  ::operator[](&this->progress,(key_type *)local_1a0);
        iVar9 = (int)*pmVar17;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_1a0 + 0x10)) {
          operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
        }
        sVar18 = std::deque<util::variant,_std::allocator<util::variant>_>::size(&expr->args);
        pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar12 = (long)pvVar13 -
                 (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 6;
        if (sVar18 < 2) {
          if (7 < uVar12) {
            pvVar13 = (_Elt_pointer)
                      ((ulong)(((uint)uVar12 & 7) << 6) +
                      *(long *)((long)(expr->args).
                                      super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_node +
                               (uVar12 & 0xfffffffffffffff8)));
          }
          iVar11 = util::variant::GetInt(pvVar13);
          bVar6 = iVar11 == iVar9;
          goto LAB_0018a02f;
        }
        if (7 < uVar12) {
          pvVar13 = (_Elt_pointer)
                    ((ulong)(((uint)uVar12 & 7) << 6) +
                    *(long *)((long)(expr->args).
                                    super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_node +
                             (uVar12 & 0xfffffffffffffff8)));
        }
        iVar11 = util::variant::GetInt(pvVar13);
        if (iVar11 <= iVar9) {
          pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar12 = ((long)pvVar13 -
                    (long)(expr->args).
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 6) + 1;
          if (uVar12 < 8) {
            pvVar19 = pvVar13 + 1;
          }
          else {
            pvVar19 = (variant *)
                      ((ulong)(((uint)uVar12 & 7) << 6) +
                      *(long *)((long)(expr->args).
                                      super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_node +
                               (uVar12 & 0xfffffffffffffff8)));
          }
          iVar11 = util::variant::GetInt(pvVar19);
          bVar6 = iVar9 <= iVar11;
          goto LAB_0018a02f;
        }
LAB_00189b04:
        bVar6 = false;
      }
      else {
        iVar9 = std::__cxx11::string::compare((char *)local_1c0);
        if (iVar9 == 0) {
          pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar12 = ((long)pvVar13 -
                    (long)(expr->args).
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 6) + 1;
          if (uVar12 < 8) {
            pvVar19 = pvVar13 + 1;
          }
          else {
            pvVar19 = (variant *)
                      ((ulong)(((uint)uVar12 & 7) << 6) +
                      *(long *)((long)(expr->args).
                                      super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_node +
                               (uVar12 & 0xfffffffffffffff8)));
          }
          util::variant::GetString_abi_cxx11_((string *)local_1a0,pvVar19);
          pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar12 = (long)pvVar13 -
                   (long)(expr->args).
                         super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                         super__Deque_impl_data._M_start._M_first >> 6;
          if (7 < uVar12) {
            pvVar13 = (_Elt_pointer)
                      ((ulong)(((uint)uVar12 & 7) << 6) +
                      *(long *)((long)(expr->args).
                                      super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_node +
                               (uVar12 & 0xfffffffffffffff8)));
          }
          util::variant::GetString_abi_cxx11_(&local_180,pvVar13);
          pbVar22 = (_Elt_pointer)local_150;
          local_160[0] = pbVar22;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"=","");
          __l._M_len = 3;
          __l._M_array = (iterator)local_1a0;
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::deque(&local_c0,__l,&local_1c1);
          bVar6 = rpn_char_eval(&local_c0,this->character);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque(&local_c0);
          lVar21 = -0x60;
          do {
            if (pbVar22 != (_Elt_pointer)pbVar22[-1].field_2._M_allocated_capacity) {
              operator_delete((_Elt_pointer)pbVar22[-1].field_2._M_allocated_capacity,
                              (ulong)((pbVar22->_M_dataplus)._M_p + 1));
            }
            pbVar22 = pbVar22 + -1;
            lVar21 = lVar21 + 0x20;
          } while (lVar21 != 0);
          goto LAB_0018a02f;
        }
        iVar9 = std::__cxx11::string::compare((char *)local_1c0);
        if (iVar9 == 0) {
          pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar12 = ((long)pvVar13 -
                    (long)(expr->args).
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 6) + 1;
          if (uVar12 < 8) {
            pvVar19 = pvVar13 + 1;
          }
          else {
            pvVar19 = (variant *)
                      ((ulong)(((uint)uVar12 & 7) << 6) +
                      *(long *)((long)(expr->args).
                                      super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_node +
                               (uVar12 & 0xfffffffffffffff8)));
          }
          util::variant::GetString_abi_cxx11_((string *)local_1a0,pvVar19);
          pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar12 = (long)pvVar13 -
                   (long)(expr->args).
                         super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                         super__Deque_impl_data._M_start._M_first >> 6;
          if (7 < uVar12) {
            pvVar13 = (_Elt_pointer)
                      ((ulong)(((uint)uVar12 & 7) << 6) +
                      *(long *)((long)(expr->args).
                                      super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_node +
                               (uVar12 & 0xfffffffffffffff8)));
          }
          util::variant::GetString_abi_cxx11_(&local_180,pvVar13);
          pbVar22 = (_Elt_pointer)local_150;
          local_160[0] = pbVar22;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"=","");
          __l_00._M_len = 3;
          __l_00._M_array = (iterator)local_1a0;
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::deque(&local_c0,__l_00,&local_1c1);
          bVar6 = rpn_char_eval(&local_c0,this->character);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque(&local_c0);
          lVar21 = -0x60;
          do {
            if (pbVar22 != (_Elt_pointer)pbVar22[-1].field_2._M_allocated_capacity) {
              operator_delete((_Elt_pointer)pbVar22[-1].field_2._M_allocated_capacity,
                              (ulong)((pbVar22->_M_dataplus)._M_p + 1));
            }
            pbVar22 = pbVar22 + -1;
            lVar21 = lVar21 + 0x20;
          } while (lVar21 != 0);
          goto LAB_0018a02f;
        }
        iVar9 = std::__cxx11::string::compare((char *)local_1c0);
        if (iVar9 == 0) {
          pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar12 = ((long)pvVar13 -
                    (long)(expr->args).
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 6) + 1;
          if (uVar12 < 8) {
            pvVar19 = pvVar13 + 1;
          }
          else {
            pvVar19 = (variant *)
                      ((ulong)(((uint)uVar12 & 7) << 6) +
                      *(long *)((long)(expr->args).
                                      super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_node +
                               (uVar12 & 0xfffffffffffffff8)));
          }
          util::variant::GetString_abi_cxx11_((string *)local_1a0,pvVar19);
          pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar12 = (long)pvVar13 -
                   (long)(expr->args).
                         super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                         super__Deque_impl_data._M_start._M_first >> 6;
          if (7 < uVar12) {
            pvVar13 = (_Elt_pointer)
                      ((ulong)(((uint)uVar12 & 7) << 6) +
                      *(long *)((long)(expr->args).
                                      super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_node +
                               (uVar12 & 0xfffffffffffffff8)));
          }
          util::variant::GetString_abi_cxx11_(&local_180,pvVar13);
          pbVar22 = (_Elt_pointer)local_150;
          local_160[0] = pbVar22;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_160,">","");
          __l_01._M_len = 3;
          __l_01._M_array = (iterator)local_1a0;
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::deque(&local_c0,__l_01,&local_1c1);
          bVar6 = rpn_char_eval(&local_c0,this->character);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque(&local_c0);
          lVar21 = -0x60;
          do {
            if (pbVar22 != (_Elt_pointer)pbVar22[-1].field_2._M_allocated_capacity) {
              operator_delete((_Elt_pointer)pbVar22[-1].field_2._M_allocated_capacity,
                              (ulong)((pbVar22->_M_dataplus)._M_p + 1));
            }
            pbVar22 = pbVar22 + -1;
            lVar21 = lVar21 + 0x20;
          } while (lVar21 != 0);
          goto LAB_0018a02f;
        }
        iVar9 = std::__cxx11::string::compare((char *)local_1c0);
        if (iVar9 == 0) {
          pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar12 = ((long)pvVar13 -
                    (long)(expr->args).
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 6) + 1;
          if (uVar12 < 8) {
            pvVar19 = pvVar13 + 1;
          }
          else {
            pvVar19 = (variant *)
                      ((ulong)(((uint)uVar12 & 7) << 6) +
                      *(long *)((long)(expr->args).
                                      super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_node +
                               (uVar12 & 0xfffffffffffffff8)));
          }
          util::variant::GetString_abi_cxx11_((string *)local_1a0,pvVar19);
          pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar12 = (long)pvVar13 -
                   (long)(expr->args).
                         super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                         super__Deque_impl_data._M_start._M_first >> 6;
          if (7 < uVar12) {
            pvVar13 = (_Elt_pointer)
                      ((ulong)(((uint)uVar12 & 7) << 6) +
                      *(long *)((long)(expr->args).
                                      super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_node +
                               (uVar12 & 0xfffffffffffffff8)));
          }
          util::variant::GetString_abi_cxx11_(&local_180,pvVar13);
          pbVar22 = (_Elt_pointer)local_150;
          local_160[0] = pbVar22;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"<","");
          __l_02._M_len = 3;
          __l_02._M_array = (iterator)local_1a0;
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::deque(&local_c0,__l_02,&local_1c1);
          bVar6 = rpn_char_eval(&local_c0,this->character);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque(&local_c0);
          lVar21 = -0x60;
          do {
            if (pbVar22 != (_Elt_pointer)pbVar22[-1].field_2._M_allocated_capacity) {
              operator_delete((_Elt_pointer)pbVar22[-1].field_2._M_allocated_capacity,
                              (ulong)((pbVar22->_M_dataplus)._M_p + 1));
            }
            pbVar22 = pbVar22 + -1;
            lVar21 = lVar21 + 0x20;
          } while (lVar21 != 0);
          goto LAB_0018a02f;
        }
        iVar9 = std::__cxx11::string::compare((char *)local_1c0);
        if (iVar9 == 0) {
          pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar12 = ((long)pvVar13 -
                    (long)(expr->args).
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 6) + 1;
          if (uVar12 < 8) {
            pvVar19 = pvVar13 + 1;
          }
          else {
            pvVar19 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node[uVar12 >> 3] +
                      uVar12 + (uVar12 >> 3) * -8;
          }
          util::variant::GetString_abi_cxx11_((string *)local_1a0,pvVar19);
          pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar12 = (long)pvVar13 -
                   (long)(expr->args).
                         super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                         super__Deque_impl_data._M_start._M_first >> 6;
          if (7 < uVar12) {
            pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node[uVar12 >> 3] +
                      uVar12 + (uVar12 >> 3) * -8;
          }
          util::variant::GetString_abi_cxx11_(&local_180,pvVar13);
          local_160[0] = (_Elt_pointer)local_150;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"gte","");
          pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar12 = ((long)pvVar13 -
                    (long)(expr->args).
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start._M_first >> 6) + 2;
          if (uVar12 < 8) {
            pvVar19 = pvVar13 + 2;
          }
          else {
            pvVar19 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node[uVar12 >> 3] +
                      uVar12 + (uVar12 >> 3) * -8;
          }
          util::variant::GetString_abi_cxx11_((string *)(local_150 + 0x10),pvVar19);
          pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar12 = (long)pvVar13 -
                   (long)(expr->args).
                         super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                         super__Deque_impl_data._M_start._M_first >> 6;
          if (7 < uVar12) {
            pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                      _M_impl.super__Deque_impl_data._M_start._M_node[uVar12 >> 3] +
                      uVar12 + (uVar12 >> 3) * -8;
          }
          util::variant::GetString_abi_cxx11_(&local_120,pvVar13);
          local_100[0] = local_f0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"lte","");
          plVar23 = local_d0;
          local_e0[0] = plVar23;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"and","");
          __l_03._M_len = 7;
          __l_03._M_array = (iterator)local_1a0;
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::deque(&local_c0,__l_03,&local_1c1);
          bVar6 = rpn_char_eval(&local_c0,this->character);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque(&local_c0);
          lVar21 = -0xe0;
          do {
            if (plVar23 != (long *)plVar23[-2]) {
              operator_delete((long *)plVar23[-2],*plVar23 + 1);
            }
            plVar23 = plVar23 + -4;
            lVar21 = lVar21 + 0x20;
          } while (lVar21 != 0);
          goto LAB_0018a02f;
        }
        iVar9 = std::__cxx11::string::compare((char *)local_1c0);
        if (iVar9 == 0) {
          pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar12 = (long)pvVar13 -
                   (long)(expr->args).
                         super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                         super__Deque_impl_data._M_start._M_first >> 6;
          if (7 < uVar12) {
            pvVar13 = (_Elt_pointer)
                      ((ulong)(((uint)uVar12 & 7) << 6) +
                      *(long *)((long)(expr->args).
                                      super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_node +
                               (uVar12 & 0xfffffffffffffff8)));
          }
          util::variant::GetString_abi_cxx11_(&local_50,pvVar13);
          util::rpn_parse((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_1a0,&local_50);
          bVar6 = rpn_char_eval((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_1a0,this->character);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1a0);
          local_1a0._16_8_ = local_50.field_2._M_allocated_capacity;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0018a02f;
        }
        else {
          iVar9 = std::__cxx11::string::compare((char *)local_1c0);
          if (iVar9 != 0) goto LAB_00189b04;
          pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_cur;
          uVar12 = (long)pvVar13 -
                   (long)(expr->args).
                         super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                         super__Deque_impl_data._M_start._M_first >> 6;
          if (7 < uVar12) {
            pvVar13 = (_Elt_pointer)
                      ((ulong)(((uint)uVar12 & 7) << 6) +
                      *(long *)((long)(expr->args).
                                      super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_node +
                               (uVar12 & 0xfffffffffffffff8)));
          }
          util::variant::GetString_abi_cxx11_(&local_70,pvVar13);
          util::rpn_parse_v2((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_1a0,&local_70);
          bVar6 = rpn_char_eval((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_1a0,this->character);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1a0);
          local_1a0._16_8_ = local_70.field_2._M_allocated_capacity;
          local_50._M_dataplus._M_p = local_70._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0018a02f;
        }
LAB_001899f9:
        operator_delete(local_50._M_dataplus._M_p,
                        (ulong)((long)&(((_Elt_pointer)local_1a0._16_8_)->_M_dataplus)._M_p + 1));
      }
      goto LAB_0018a02f;
    }
    pvVar13 = (expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    uVar12 = (long)pvVar13 -
             (long)(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_first >> 6;
    if (7 < uVar12) {
      pvVar13 = (_Elt_pointer)
                ((ulong)(((uint)uVar12 & 7) << 6) +
                *(long *)((long)(expr->args).
                                super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                _M_impl.super__Deque_impl_data._M_start._M_node +
                         (uVar12 & 0xfffffffffffffff8)));
    }
    pCVar5 = this->character;
    iVar9 = util::variant::GetInt(pvVar13);
    local_1a0._0_4_ = iVar9;
    piVar16 = std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        (&pCVar5->paperdoll,&pCVar5->cosmetic_paperdoll);
    bVar6 = (array<int,_15UL> *)piVar16 == &this->character->cosmetic_paperdoll;
  }
  bVar6 = !bVar6;
LAB_0018a02f:
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  return bVar6;
}

Assistant:

bool Quest_Context::CheckRule(const EOPlus::Expression& expr)
{
	if (this->quest->Disabled())
		return false;

	std::string function_name = expr.function;

	if (function_name == "always")
	{
		return true;
	}
	else if (function_name == "donedaily")
	{
		if (this->progress["d"] == quest_day())
		{
			return this->progress["c"] >= int(expr.args[0]);
		}
		else
		{
			this->progress["d"] = quest_day();
			this->progress["c"] = 0;
			return false;
		}
	}
	else if (function_name == "entermap")
	{
		return this->character->map->id == int(expr.args[0]);
	}
	else if (function_name == "entercoord")
	{
		return this->character->map->id == int(expr.args[0])
		    && this->character->x == int(expr.args[1])
		    && this->character->y == int(expr.args[2]);
	}
	else if (function_name == "leavemap")
	{
		return this->character->map->id != int(expr.args[0]);
	}
	else if (function_name == "leavecoord")
	{
		return this->character->map->id != int(expr.args[0])
		    || this->character->x != int(expr.args[1])
		    || this->character->y != int(expr.args[2]);
	}
	else if (function_name == "gotitems")
	{
		return this->character->HasItem(int(expr.args[0])) >= (expr.args.size() >= 2 ? int(expr.args[1]) : 1);
	}
	else if (function_name == "lostitems")
	{
		return this->character->HasItem(int(expr.args[0])) < (expr.args.size() >= 2 ? int(expr.args[1]) : 1);
	}
	else if (function_name == "gotspell")
	{
		return this->character->HasSpell(int(expr.args[0]))
		    && (expr.args.size() < 2 || this->character->SpellLevel(int(expr.args[0])) >= int(expr.args[1]));
	}
	else if (function_name == "lostspell")
	{
		return !this->character->HasSpell(int(expr.args[0]));
	}
	else if (function_name == "isgender")
	{
		return this->character->gender == Gender(int(expr.args[0]));
	}
	else if (function_name == "isclass")
	{
		return this->character->clas == int(expr.args[0]);
	}
	else if (function_name == "israce")
	{
		return this->character->race == int(expr.args[0]);
	}
	else if (function_name == "iswearing")
	{
		return std::find(UTIL_CRANGE(this->character->paperdoll), int(expr.args[0])) != this->character->paperdoll.end();
	}
	else if (function_name == "citizenof")
	{
		return this->character->home == std::string(expr.args[0]);
	}
	else if (function_name == "rolled")
	{
		int roll = this->progress["r"];

		if (expr.args.size() < 2)
		{
			return roll == int(expr.args[0]);
		}
		else
		{
			return roll >= int(expr.args[0])
			    && roll <= int(expr.args[1]);
		}
	}
	else if (function_name == "statis")
	{
		return rpn_char_eval({expr.args[1], expr.args[0], "="}, character);
	}
	else if (function_name == "statnot")
	{
		return rpn_char_eval({expr.args[1], expr.args[0], "="}, character);
	}
	else if (function_name == "statgreater")
	{
		return rpn_char_eval({expr.args[1], expr.args[0], ">"}, character);
	}
	else if (function_name == "statless")
	{
		return rpn_char_eval({expr.args[1], expr.args[0], "<"}, character);
	}
	else if (function_name == "statbetween")
	{
		return rpn_char_eval({expr.args[1], expr.args[0], "gte", expr.args[2], expr.args[0], "lte", "and"}, character);
	}
	else if (function_name == "statrpn")
	{
		return rpn_char_eval(util::rpn_parse(expr.args[0]), character);
	}
	else if (function_name == "stateval")
	{
		return rpn_char_eval(util::rpn_parse_v2(expr.args[0]), character);
	}

	return false;
}